

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy.hpp
# Opt level: O2

SphereTree *
sphere_hierarchy(SphereTree *__return_storage_ptr__,vector<Sphere,_std::allocator<Sphere>_> *spheres
                )

{
  undefined8 *puVar1;
  pointer pSVar2;
  float fVar3;
  pointer pSVar4;
  invalid_argument *this;
  SphereTree *p;
  long lVar5;
  pointer pSVar6;
  SphereTree *pSVar7;
  SphereTree *pSVar8;
  pointer pSVar9;
  ulong uVar10;
  pointer pSVar11;
  SphereTree *t;
  data_t dVar12;
  data_t dVar13;
  float fVar14;
  Sphere SVar15;
  float local_f0;
  vector<SphereTree,_std::allocator<SphereTree>_> parents;
  vector<SphereTree,_std::allocator<SphereTree>_> nodes;
  SphereTree o;
  _Vector_base<Sphere,_std::allocator<Sphere>_> local_70;
  SphereTree local_58;
  
  github111116::ConsoleLogger::log<char[29]>(&console,(char (*) [29])"building sphere hierarchy...")
  ;
  nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pSVar2 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar11 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
                 super__Vector_impl_data._M_start; pSVar11 != pSVar2; pSVar11 = pSVar11 + 1) {
    o.bound.center.x = (pSVar11->center).x;
    o.bound.center.y = (pSVar11->center).y;
    o.bound._8_8_ = *(undefined8 *)&(pSVar11->center).z;
    o.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    o.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    o.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<SphereTree,_std::allocator<SphereTree>_>::emplace_back<SphereTree>(&nodes,&o);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&o.child);
  }
  do {
    if ((ulong)(((long)nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) < 2) {
      SphereTree::SphereTree
                (__return_storage_ptr__,
                 nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&nodes);
      return __return_storage_ptr__;
    }
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<SphereTree*,std::vector<SphereTree,std::allocator<SphereTree>>>>
              ((__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                )nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar5 = 8;
    for (uVar10 = 0;
        uVar10 <= ((long)nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x28 - 1U >> 2; uVar10 = uVar10 + 1) {
      puVar1 = (undefined8 *)
               ((long)nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5 + -8);
      o.bound.center._0_8_ = *puVar1;
      o.bound._8_8_ = puVar1[1];
      o.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      o.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      o.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<SphereTree,_std::allocator<SphereTree>_>::emplace_back<SphereTree>(&parents,&o);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&o.child);
      lVar5 = lVar5 + 0x28;
    }
    pSVar6 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar9 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
             super__Vector_impl_data._M_finish;
    fVar14 = 1e+18;
    do {
      for (; pSVar4 = nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_finish,
          pSVar7 = nodes.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_start, pSVar6 != pSVar9; pSVar6 = pSVar6 + 1) {
        std::vector<SphereTree,_std::allocator<SphereTree>_>::clear(&pSVar6->child);
      }
      for (; pSVar9 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_finish,
          pSVar8 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_start, pSVar7 != pSVar4; pSVar7 = pSVar7 + 1) {
        SphereTree::SphereTree(&o,pSVar7);
        SphereTree::SphereTree(&local_58,&o);
        pSVar9 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pSVar6 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar8 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_start ==
            parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"empty container is not allowed.");
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        while (t = pSVar6, pSVar8 = pSVar8 + 1, pSVar8 != pSVar9) {
          dVar12 = sphere_hierarchy::anon_class_40_1_54a3980f::operator()
                             ((anon_class_40_1_54a3980f *)&local_58,pSVar8);
          dVar13 = sphere_hierarchy::anon_class_40_1_54a3980f::operator()
                             ((anon_class_40_1_54a3980f *)&local_58,t);
          pSVar6 = pSVar8;
          if (dVar13 <= dVar12) {
            pSVar6 = t;
          }
        }
        std::vector<SphereTree,_std::allocator<SphereTree>_>::push_back(&t->child,&o);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_58.child);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&o.child);
      }
      for (; pSVar6 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_finish, pSVar8 != pSVar9; pSVar8 = pSVar8 + 1) {
        sphere_tree_leaves((vector<Sphere,_std::allocator<Sphere>_> *)&local_70,pSVar8);
        SVar15 = sphere_set_bounding_sphere((vector<Sphere,_std::allocator<Sphere>_> *)&local_70);
        pSVar8->bound = SVar15;
        std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base(&local_70);
      }
      local_f0 = 0.0;
      for (pSVar9 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                    super__Vector_impl_data._M_start; pSVar9 != pSVar6; pSVar9 = pSVar9 + 1) {
        SphereTree::SphereTree(&o,pSVar9);
        local_f0 = local_f0 + o.bound.radius;
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&o.child);
      }
      if (fVar14 < local_f0) {
        github111116::ConsoleLogger::debug<char[35]>
                  (&console,(char (*) [35])"sphere clustering: loss increasing");
      }
      fVar3 = fVar14 + -1e-05;
      pSVar6 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar9 = parents.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_finish;
      fVar14 = local_f0;
    } while (local_f0 <= fVar3);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::operator=(&nodes,&parents);
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&parents);
  } while( true );
}

Assistant:

SphereTree sphere_hierarchy(std::vector<Sphere> spheres)
{
	console.log("building sphere hierarchy...");
	// build leaf nodes
	std::vector<SphereTree> nodes;
	for (auto s: spheres)
		nodes.push_back(SphereTree(s));
	// successively form next layer
	while (nodes.size() > 1) {
		// randomly select representatives
		std::random_shuffle(nodes.begin(), nodes.end());
		std::vector<SphereTree> parents;
		for (int i=0; i<(nodes.size()-1)/4+1; ++i)
			parents.push_back(SphereTree(nodes[i].bound));
		// iteratively assign & optimize
		float lastloss = 1e18;
		while (true) {
			// stage 1. assign
			for (auto& p: parents)
				p.child.clear();
			for (auto o: nodes)
				argmin(parents, [o](const SphereTree& t){return norm(t.bound.center - o.bound.center);})->child.push_back(o);
			// state 2. optimize
			for (auto& p: parents)
				p.bound = sphere_set_bounding_sphere(sphere_tree_leaves(p));
			// calculate total loss
			float curloss = 0;
			for (auto p: parents)
				curloss += p.bound.radius;
			if (curloss > lastloss)
				console.debug("sphere clustering: loss increasing");
			if (curloss > lastloss - 1e-5)
				break;
			lastloss = curloss;
		}
		nodes = parents;
	}
	return nodes[0];
}